

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O3

int run_ipc_send_recv_helper(uv_loop_t *loop,int inprocess)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  undefined8 *extraout_RDX;
  int iVar5;
  echo_ctx *peVar6;
  uv_loop_t *puVar7;
  uv_buf_t uStack_430;
  undefined1 auStack_420 [144];
  code *pcStack_390;
  uv_loop_t uStack_388;
  uv_loop_t *puStack_38;
  uv_loop_t *puStack_30;
  code *pcStack_28;
  code *pcStack_20;
  
  pcStack_20 = (code *)0x15f408;
  is_in_process = inprocess;
  memset(&ctx2,0,0x608);
  iVar2 = 0x2fe958;
  pcStack_20 = (code *)0x15f415;
  peVar6 = (echo_ctx *)loop;
  iVar1 = uv_pipe_init(loop,&ctx2.listen,0);
  if (iVar1 == 0) {
    iVar2 = 0x2fea60;
    pcStack_20 = (code *)0x15f431;
    peVar6 = (echo_ctx *)loop;
    iVar1 = uv_pipe_init(loop,&ctx2.channel,1);
    if (iVar1 != 0) goto LAB_0015f4a7;
    if (inprocess != 0) {
      peVar6 = &ctx2;
      iVar2 = 0x19044d;
      pcStack_20 = (code *)0x15f44c;
      iVar1 = uv_pipe_bind(&ctx2.listen,"/tmp/uv-test-sock3");
      if (iVar1 == 0) {
        pcStack_20 = (code *)0x15f468;
        iVar1 = uv_listen((uv_stream_t *)&ctx2,0x1000,listen_cb);
        if (iVar1 != 0) {
          pcStack_20 = (code *)0x15f471;
          run_ipc_send_recv_helper_cold_4();
          goto LAB_0015f471;
        }
        goto LAB_0015f488;
      }
      goto LAB_0015f4b1;
    }
LAB_0015f471:
    peVar6 = (echo_ctx *)&ctx2.channel;
    iVar2 = 0;
    pcStack_20 = (code *)0x15f47f;
    iVar1 = uv_pipe_open(&ctx2.channel,0);
    if (iVar1 == 0) {
      pcStack_20 = (code *)0x15f488;
      send_recv_start();
LAB_0015f488:
      pcStack_20 = (code *)0x15f48d;
      notify_parent_process();
      iVar2 = 0;
      pcStack_20 = (code *)0x15f497;
      peVar6 = (echo_ctx *)loop;
      iVar1 = uv_run(loop,UV_RUN_DEFAULT);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015f4ac;
    }
  }
  else {
    pcStack_20 = (code *)0x15f4a7;
    run_ipc_send_recv_helper_cold_1();
LAB_0015f4a7:
    pcStack_20 = (code *)0x15f4ac;
    run_ipc_send_recv_helper_cold_2();
LAB_0015f4ac:
    pcStack_20 = (code *)0x15f4b1;
    run_ipc_send_recv_helper_cold_6();
LAB_0015f4b1:
    pcStack_20 = (code *)0x15f4b6;
    run_ipc_send_recv_helper_cold_3();
  }
  pcStack_20 = listen_cb;
  run_ipc_send_recv_helper_cold_5();
  if (peVar6 == &ctx2) {
    if (iVar2 != 0) goto LAB_0015f4eb;
    pcStack_28 = (code *)0x15f4df;
    iVar1 = uv_accept((uv_stream_t *)&ctx2,(uv_stream_t *)&ctx2.channel);
    if (iVar1 == 0) {
      send_recv_start();
      return extraout_EAX;
    }
  }
  else {
    pcStack_28 = (code *)0x15f4eb;
    listen_cb_cold_1();
LAB_0015f4eb:
    pcStack_28 = (code *)0x15f4f0;
    listen_cb_cold_2();
  }
  pcStack_28 = send_recv_start;
  listen_cb_cold_3();
  puStack_30 = (uv_loop_t *)0x15f502;
  pcStack_28._0_4_ = extraout_EAX_00;
  iVar1 = uv_is_readable((uv_stream_t *)&ctx2.channel);
  if (iVar1 == 1) {
    puStack_30 = (uv_loop_t *)0x15f513;
    iVar1 = uv_is_writable((uv_stream_t *)&ctx2.channel);
    if (iVar1 != 1) goto LAB_0015f54d;
    puStack_30 = (uv_loop_t *)0x15f524;
    iVar1 = uv_is_closing((uv_handle_t *)&ctx2.channel);
    if (iVar1 != 0) goto LAB_0015f552;
    puStack_30 = (uv_loop_t *)0x15f542;
    iVar1 = uv_read_start((uv_stream_t *)&ctx2.channel,alloc_cb,read_cb);
    if (iVar1 == 0) {
      return (int)pcStack_28;
    }
  }
  else {
    puStack_30 = (uv_loop_t *)0x15f54d;
    send_recv_start_cold_1();
LAB_0015f54d:
    puStack_30 = (uv_loop_t *)0x15f552;
    send_recv_start_cold_2();
LAB_0015f552:
    puStack_30 = (uv_loop_t *)0x15f557;
    send_recv_start_cold_3();
  }
  puStack_30 = (uv_loop_t *)ipc_send_recv_helper;
  send_recv_start_cold_4();
  puStack_38 = (uv_loop_t *)0x15f562;
  puStack_30 = loop;
  puVar3 = uv_default_loop();
  puStack_38 = (uv_loop_t *)0x15f56c;
  run_ipc_send_recv_helper(puVar3,0);
  puStack_38 = (uv_loop_t *)0x15f571;
  puVar3 = uv_default_loop();
  puStack_38 = (uv_loop_t *)0x15f585;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_38 = (uv_loop_t *)0x15f58f;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_38 = (uv_loop_t *)0x15f594;
  puVar4 = uv_default_loop();
  puStack_38 = (uv_loop_t *)0x15f59c;
  iVar1 = uv_loop_close(puVar4);
  if (iVar1 == 0) {
    return 0;
  }
  puStack_38 = (uv_loop_t *)ipc_send_recv_helper_threadproc;
  ipc_send_recv_helper_cold_1();
  iVar1 = (int)&uStack_388;
  pcStack_390 = (code *)0x15f5b9;
  puStack_38 = puVar3;
  iVar2 = uv_loop_init(&uStack_388);
  if (iVar2 == 0) {
    pcStack_390 = (code *)0x15f5cd;
    run_ipc_send_recv_helper(&uStack_388,1);
    pcStack_390 = (code *)0x15f5d5;
    iVar1 = (int)&uStack_388;
    iVar2 = uv_loop_close(&uStack_388);
    puVar3 = &uStack_388;
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_390 = (code *)0x15f5e7;
    ipc_send_recv_helper_threadproc_cold_1();
  }
  pcStack_390 = run_test;
  ipc_send_recv_helper_threadproc_cold_2();
  puVar4 = (uv_loop_t *)auStack_420;
  puVar7 = (uv_loop_t *)auStack_420;
  pcStack_390 = (code *)puVar3;
  if (iVar1 == 0) {
    uStack_430.len = 0x15f67c;
    spawn_helper(&ctx.channel,(uv_process_t *)(auStack_420 + 8),"ipc_send_recv_helper");
    uStack_430.len = 0x15f68a;
    connect_cb(&ctx.connect_req,0);
LAB_0015f68a:
    uStack_430.len = 0x15f68f;
    puVar4 = uv_default_loop();
    iVar5 = 0;
    uStack_430.len = 0x15f699;
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) {
      uStack_430.len = 0x15f6c4;
      run_test_cold_3();
LAB_0015f6c4:
      uStack_430.len = 0x15f6c9;
      run_test_cold_4();
LAB_0015f6c9:
      uStack_430.len = 0x15f6ce;
      run_test_cold_1();
      goto LAB_0015f6ce;
    }
    if (recv_cb_count != 2) goto LAB_0015f6c4;
    if (iVar1 == 0) {
      return 0;
    }
    uStack_430.len = 0x15f6b2;
    iVar1 = uv_thread_join((uv_thread_t *)auStack_420);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    iVar5 = 0x15f5a9;
    uStack_430.len = 0x15f60e;
    iVar2 = uv_thread_create((uv_thread_t *)auStack_420,ipc_send_recv_helper_threadproc,(void *)0x2a
                            );
    if (iVar2 != 0) goto LAB_0015f6c9;
    uStack_430.len = 0x15f620;
    uv_sleep(1000);
    uStack_430.len = 0x15f625;
    puVar4 = uv_default_loop();
    iVar5 = 0x2fef60;
    uStack_430.len = 0x15f639;
    iVar2 = uv_pipe_init(puVar4,&ctx.channel,1);
    if (iVar2 == 0) {
      uStack_430.len = 0x15f662;
      uv_pipe_connect(&ctx.connect_req,&ctx.channel,"/tmp/uv-test-sock3",connect_cb);
      goto LAB_0015f68a;
    }
LAB_0015f6ce:
    puVar7 = puVar4;
    uStack_430.len = 0x15f6d3;
    run_test_cold_2();
  }
  uStack_430.len = (size_t)connect_cb;
  run_test_cold_5();
  if (puVar7 == (uv_loop_t *)&ctx.connect_req) {
    if (iVar5 != 0) goto LAB_0015f7a8;
    uStack_430 = uv_buf_init(".",1);
    iVar1 = uv_write2(&ctx.write_req,(uv_stream_t *)&ctx,&uStack_430,1,&ctx.send.stream,
                      (uv_write_cb)0x0);
    if (iVar1 != 0) goto LAB_0015f7ad;
    uStack_430 = uv_buf_init(".",1);
    iVar1 = uv_write2(&ctx.write_req2,(uv_stream_t *)&ctx,&uStack_430,1,&ctx.send2.stream,
                      (uv_write_cb)0x0);
    if (iVar1 == 0) {
      iVar1 = uv_read_start((uv_stream_t *)&ctx,alloc_cb,recv_cb);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015f7b7;
    }
  }
  else {
    connect_cb_cold_1();
LAB_0015f7a8:
    connect_cb_cold_2();
LAB_0015f7ad:
    connect_cb_cold_3();
  }
  connect_cb_cold_4();
LAB_0015f7b7:
  connect_cb_cold_5();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 8;
  return 0x2ff734;
}

Assistant:

int run_ipc_send_recv_helper(uv_loop_t* loop, int inprocess) {
  int r;

  is_in_process = inprocess;

  memset(&ctx2, 0, sizeof(ctx2));

  r = uv_pipe_init(loop, &ctx2.listen, 0);
  ASSERT(r == 0);

  r = uv_pipe_init(loop, &ctx2.channel, 1);
  ASSERT(r == 0);

  if (inprocess) {
    r = uv_pipe_bind(&ctx2.listen, TEST_PIPENAME_3);
    ASSERT(r == 0);

    r = uv_listen((uv_stream_t*)&ctx2.listen, SOMAXCONN, listen_cb);
    ASSERT(r == 0);
  } else {
    r = uv_pipe_open(&ctx2.channel, 0);
    ASSERT(r == 0);

    send_recv_start();
  }

  notify_parent_process();
  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  return 0;
}